

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluUtil.cpp
# Opt level: O0

NativeWindowFactory *
eglu::selectFactory<eglu::NativeWindowFactory>
          (FactoryRegistry<eglu::NativeWindowFactory> *registry,char *objectTypeName,
          char *cmdLineArg)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  NativeWindowFactory *pNVar4;
  size_t sVar5;
  undefined4 extraout_var;
  char *pcVar6;
  NotSupportedError *pNVar7;
  allocator<char> local_179;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  undefined1 local_112;
  allocator<char> local_111;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  ulong local_70;
  size_t ndx;
  allocator<char> local_51;
  string local_50;
  NativeWindowFactory *local_30;
  NativeWindowFactory *factory;
  char *cmdLineArg_local;
  char *objectTypeName_local;
  FactoryRegistry<eglu::NativeWindowFactory> *registry_local;
  
  factory = (NativeWindowFactory *)cmdLineArg;
  cmdLineArg_local = objectTypeName;
  objectTypeName_local = (char *)registry;
  if (cmdLineArg == (char *)0x0) {
    bVar2 = tcu::FactoryRegistry<eglu::NativeWindowFactory>::empty(registry);
    if (bVar2) {
      pNVar7 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_178,"No factory supporting EGL \'",&local_179);
      std::operator+(&local_158,&local_178,cmdLineArg_local);
      std::operator+(&local_138,&local_158,"\' type");
      pcVar6 = (char *)std::__cxx11::string::c_str();
      tcu::NotSupportedError::NotSupportedError
                (pNVar7,pcVar6,(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluUtil.cpp"
                 ,0x1ce);
      __cxa_throw(pNVar7,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
    registry_local =
         (FactoryRegistry<eglu::NativeWindowFactory> *)
         tcu::FactoryRegistry<eglu::NativeWindowFactory>::getDefaultFactory
                   ((FactoryRegistry<eglu::NativeWindowFactory> *)objectTypeName_local);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,cmdLineArg,&local_51);
    pNVar4 = tcu::FactoryRegistry<eglu::NativeWindowFactory>::getFactoryByName(registry,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator(&local_51);
    registry_local = (FactoryRegistry<eglu::NativeWindowFactory> *)pNVar4;
    if (pNVar4 == (NativeWindowFactory *)0x0) {
      local_30 = pNVar4;
      tcu::print("ERROR: Unknown or unsupported EGL %s type \'%s\'",cmdLineArg_local,factory);
      tcu::print("Available EGL %s types:\n",cmdLineArg_local);
      for (local_70 = 0; uVar1 = local_70,
          sVar5 = tcu::FactoryRegistry<eglu::NativeWindowFactory>::getFactoryCount
                            ((FactoryRegistry<eglu::NativeWindowFactory> *)objectTypeName_local),
          uVar1 < sVar5; local_70 = local_70 + 1) {
        pNVar4 = tcu::FactoryRegistry<eglu::NativeWindowFactory>::getFactoryByIndex
                           ((FactoryRegistry<eglu::NativeWindowFactory> *)objectTypeName_local,
                            local_70);
        iVar3 = (*(pNVar4->super_FactoryBase).super_AbstractFactory._vptr_AbstractFactory[2])();
        pNVar4 = tcu::FactoryRegistry<eglu::NativeWindowFactory>::getFactoryByIndex
                           ((FactoryRegistry<eglu::NativeWindowFactory> *)objectTypeName_local,
                            local_70);
        pcVar6 = tcu::FactoryBase::getDescription(&pNVar4->super_FactoryBase);
        tcu::print("  %s: %s\n",CONCAT44(extraout_var,iVar3),pcVar6);
      }
      local_112 = 1;
      pNVar7 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_110,"Unsupported or unknown EGL ",&local_111);
      std::operator+(&local_f0,&local_110,cmdLineArg_local);
      std::operator+(&local_d0,&local_f0," type \'");
      std::operator+(&local_b0,&local_d0,(char *)factory);
      std::operator+(&local_90,&local_b0,"\'");
      pcVar6 = (char *)std::__cxx11::string::c_str();
      tcu::NotSupportedError::NotSupportedError
                (pNVar7,pcVar6,(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluUtil.cpp"
                 ,0x1c8);
      local_112 = 0;
      __cxa_throw(pNVar7,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
  }
  return (NativeWindowFactory *)registry_local;
}

Assistant:

static const Factory& selectFactory (const tcu::FactoryRegistry<Factory>& registry, const char* objectTypeName, const char* cmdLineArg)
{
	if (cmdLineArg)
	{
		const Factory* factory = registry.getFactoryByName(cmdLineArg);

		if (factory)
			return *factory;
		else
		{
			tcu::print("ERROR: Unknown or unsupported EGL %s type '%s'", objectTypeName, cmdLineArg);
			tcu::print("Available EGL %s types:\n", objectTypeName);
			for (size_t ndx = 0; ndx < registry.getFactoryCount(); ndx++)
				tcu::print("  %s: %s\n", registry.getFactoryByIndex(ndx)->getName(), registry.getFactoryByIndex(ndx)->getDescription());

			TCU_THROW(NotSupportedError, (string("Unsupported or unknown EGL ") + objectTypeName + " type '" + cmdLineArg + "'").c_str());
		}
	}
	else if (!registry.empty())
		return *registry.getDefaultFactory();
	else
		TCU_THROW(NotSupportedError, (string("No factory supporting EGL '") + objectTypeName + "' type").c_str());
}